

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSetMap.cxx
# Opt level: O1

cmExportSet * __thiscall cmExportSetMap::operator[](cmExportSetMap *this,string *name)

{
  pointer pcVar1;
  iterator iVar2;
  cmExportSet *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_bool>
  pVar5;
  char *local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
  local_58;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (cmExportSet *)operator_new(0x50);
    pcVar1 = (name->_M_dataplus)._M_p;
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + name->_M_string_length);
    (pcVar3->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pcVar3->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pcVar3->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar4 = &(pcVar3->Name).field_2;
    (pcVar3->Name)._M_dataplus._M_p = (pointer)paVar4;
    if (local_78 == &local_68) {
      paVar4->_M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&(pcVar3->Name).field_2 + 8) = uStack_60;
    }
    else {
      (pcVar3->Name)._M_dataplus._M_p = local_78;
      (pcVar3->Name).field_2._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    (pcVar3->Name)._M_string_length = local_70;
    local_70 = 0;
    local_68 = '\0';
    (pcVar3->Installations).
    super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pcVar3->Installations).
    super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pcVar3->Installations).
    super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar4 = &local_58.first.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_78 = &local_68;
    local_58.first._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
    local_58.second = pcVar3;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportSet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportSet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmExportSet*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportSet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportSet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
                        *)this,&local_58);
    iVar2._M_node = (_Base_ptr)pVar5.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != paVar4) {
      operator_delete(local_58.first._M_dataplus._M_p,
                      local_58.first.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return *(cmExportSet **)(iVar2._M_node + 2);
}

Assistant:

cmExportSet* cmExportSetMap::operator[](const std::string& name)
{
  std::map<std::string, cmExportSet*>::iterator it = this->find(name);
  if (it == this->end()) // Export set not found
  {
    it = this->insert(std::make_pair(name, new cmExportSet(name))).first;
  }
  return it->second;
}